

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

cmGeneratorExpressionNode * cmGeneratorExpressionNode::GetNode(string *identifier)

{
  int iVar1;
  const_iterator cVar2;
  cmGeneratorExpressionNode *pcVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  __l;
  allocator_type local_d9a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d99;
  ShellPathNode *local_d98;
  CompileLanguageNode *local_d90;
  CompileLanguageAndIdNode *local_d88;
  LinkOnlyNode *local_d80;
  JoinNode *local_d78;
  InstallPrefixNode *local_d70;
  ZeroNode *local_d68;
  OneNode *local_d60;
  GenexEvalNode *local_d58;
  TargetGenexEvalNode *local_d50;
  TargetNameIfExistsNode *local_d48;
  TargetExistsNode *local_d40;
  TargetPolicyNode *local_d38;
  TargetObjectsNode *local_d30;
  TargetNameNode *local_d28;
  TargetPropertyNode *local_d20;
  CharacterNode<___> *local_d18;
  CharacterNode<_,_> *local_d10;
  CharacterNode<_>_> *local_d08;
  IfNode *local_d00;
  BoolNode *local_cf8;
  MakeCIdentifierNode *local_cf0;
  UpperCaseNode *local_ce8;
  LowerCaseNode *local_ce0;
  RemoveDuplicatesNode *local_cd8;
  FilterNode *local_cd0;
  InListNode *local_cc8;
  EqualNode *local_cc0;
  StrEqualNode *local_cb8;
  TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag> *local_cb0;
  TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag> *local_ca8;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag> *local_ca0;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag> *local_c98;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag> *local_c90;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *local_c88;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag> *local_c80;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *local_c78;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag> *local_c70;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag> *local_c68;
  TargetFileArtifact<ArtifactLinkerFileSuffixTag> *local_c60;
  TargetFileArtifact<ArtifactFileSuffixTag> *local_c58;
  TargetFileArtifact<ArtifactLinkerFilePrefixTag> *local_c50;
  TargetFileArtifact<ArtifactFilePrefixTag> *local_c48;
  TargetFileBaseNameArtifact<ArtifactPdbTag> *local_c40;
  TargetFileBaseNameArtifact<ArtifactLinkerTag> *local_c38;
  TargetFileBaseNameArtifact<ArtifactNameTag> *local_c30;
  TargetFilesystemArtifactNodeGroup<ArtifactPdbTag> *local_c28;
  TargetFilesystemArtifactNodeGroup<ArtifactSonameTag> *local_c20;
  TargetFilesystemArtifactNodeGroup<ArtifactLinkerTag> *local_c18;
  TargetFilesystemArtifactNodeGroup<ArtifactNameTag> *local_c10;
  ConfigurationTestNode *local_c08;
  ConfigurationNode *local_c00;
  CompileFeaturesNode *local_bf8;
  PlatformIdNode *local_bf0;
  CompilerVersionNode *local_be8;
  CompilerVersionNode *local_be0;
  CompilerVersionNode *local_bd8;
  CompilerVersionNode *local_bd0;
  VersionNode<(cmSystemTools::CompareOp)1> *local_bc8;
  VersionNode<(cmSystemTools::CompareOp)3> *local_bc0;
  VersionNode<(cmSystemTools::CompareOp)2> *local_bb8;
  VersionNode<(cmSystemTools::CompareOp)5> *local_bb0;
  VersionNode<(cmSystemTools::CompareOp)4> *local_ba8;
  CompilerIdNode *local_ba0;
  CompilerIdNode *local_b98;
  CompilerIdNode *local_b90;
  CompilerIdNode *local_b88;
  NotNode *local_b80;
  BooleanOpNode *local_b78;
  BooleanOpNode *local_b70;
  OneNode *local_b68;
  ZeroNode *local_b60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ae0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ab8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_978;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_950;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_928;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_900;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_888;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_860;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_838;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_810;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_798;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_770;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_748;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_720;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_680;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_658;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_608;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_590;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_568;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_540;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_518;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_478;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_400;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_388;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_40;
  
  if (GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    if (iVar1 != 0) {
      local_b60 = &zeroNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_ZeroNode_*,_true>
                (&local_b58,(char (*) [2])0x544b6a,&local_b60);
      local_b68 = &oneNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_OneNode_*,_true>(&local_b30,(char (*) [2])0x530208,&local_b68)
      ;
      local_b70 = &andNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_BooleanOpNode_*,_true>
                (&local_b08,(char (*) [4])0x4e7455,&local_b70);
      local_b78 = &orNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_BooleanOpNode_*,_true>
                (&local_ae0,(char (*) [3])0x53ecb1,&local_b78);
      local_b80 = &notNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_NotNode_*,_true>(&local_ab8,(char (*) [4])0x510827,&local_b80)
      ;
      local_b88 = &cCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_CompilerIdNode_*,_true>
                (&local_a90,(char (*) [14])0x4fc041,&local_b88);
      local_b90 = &cxxCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_CompilerIdNode_*,_true>
                (&local_a68,(char (*) [16])0x4fc02b,&local_b90);
      local_b98 = &cudaCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompilerIdNode_*,_true>
                (&local_a40,(char (*) [17])"CUDA_COMPILER_ID",&local_b98);
      local_ba0 = &fortranCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompilerIdNode_*,_true>
                (&local_a18,(char (*) [20])0x4fc055,&local_ba0);
      local_ba8 = &versionGreaterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_VersionNode<(cmSystemTools::CompareOp)4>_*,_true>
                (&local_9f0,(char (*) [16])"VERSION_GREATER",&local_ba8);
      local_bb0 = &versionGreaterEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_VersionNode<(cmSystemTools::CompareOp)5>_*,_true>
                (&local_9c8,(char (*) [22])"VERSION_GREATER_EQUAL",&local_bb0);
      local_bb8 = &versionLessNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_VersionNode<(cmSystemTools::CompareOp)2>_*,_true>
                (&local_9a0,(char (*) [13])"VERSION_LESS",&local_bb8);
      local_bc0 = &versionLessEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_VersionNode<(cmSystemTools::CompareOp)3>_*,_true>
                (&local_978,(char (*) [19])"VERSION_LESS_EQUAL",&local_bc0);
      local_bc8 = &versionEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_VersionNode<(cmSystemTools::CompareOp)1>_*,_true>
                (&local_950,(char (*) [14])"VERSION_EQUAL",&local_bc8);
      local_bd0 = &cCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_CompilerVersionNode_*,_true>
                (&local_928,(char (*) [19])"C_COMPILER_VERSION",&local_bd0);
      local_bd8 = &cxxCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[21],_const_CompilerVersionNode_*,_true>
                (&local_900,(char (*) [21])"CXX_COMPILER_VERSION",&local_bd8);
      local_be0 = &cudaCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_CompilerVersionNode_*,_true>
                (&local_8d8,(char (*) [22])"CUDA_COMPILER_VERSION",&local_be0);
      local_be8 = &fortranCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[25],_const_CompilerVersionNode_*,_true>
                (&local_8b0,(char (*) [25])"Fortran_COMPILER_VERSION",&local_be8);
      local_bf0 = &platformIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_PlatformIdNode_*,_true>
                (&local_888,(char (*) [12])"PLATFORM_ID",&local_bf0);
      local_bf8 = &compileFeaturesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileFeaturesNode_*,_true>
                (&local_860,(char (*) [17])0x50868a,&local_bf8);
      local_c00 = &configurationNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_ConfigurationNode_*,_true>
                (&local_838,(char (*) [14])0x501a57,&local_c00);
      local_c08 = &configurationTestNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_ConfigurationTestNode_*,_true>
                (&local_810,(char (*) [7])0x4fa3f5,&local_c08);
      local_c10 = &targetNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[12],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag>_*,_true>
                (&local_7e8,(char (*) [12])0x4f755a,
                 (TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag> **)&local_c10);
      local_c18 = &targetLinkerNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag>_*,_true>
                (&local_7c0,(char (*) [19])"TARGET_LINKER_FILE",
                 (TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag> **)&local_c18);
      local_c20 = &targetSoNameNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>_*,_true>
                (&local_798,(char (*) [19])"TARGET_SONAME_FILE",
                 (TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> **)&local_c20);
      local_c28 = &targetPdbNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag>_*,_true>
                (&local_770,(char (*) [16])"TARGET_PDB_FILE",
                 (TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag> **)&local_c28);
      local_c30 = &targetFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetFileBaseNameArtifact<ArtifactNameTag>_*,_true>
                (&local_748,(char (*) [22])"TARGET_FILE_BASE_NAME",&local_c30);
      local_c38 = &targetLinkerFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[29],_const_TargetFileBaseNameArtifact<ArtifactLinkerTag>_*,_true>
                (&local_720,(char (*) [29])"TARGET_LINKER_FILE_BASE_NAME",&local_c38);
      local_c40 = &targetPdbFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileBaseNameArtifact<ArtifactPdbTag>_*,_true>
                (&local_6f8,(char (*) [26])"TARGET_PDB_FILE_BASE_NAME",&local_c40);
      local_c48 = &targetFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFilePrefixTag>_*,_true>
                (&local_6d0,(char (*) [19])"TARGET_FILE_PREFIX",&local_c48);
      local_c50 = &targetLinkerFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFilePrefixTag>_*,_true>
                (&local_6a8,(char (*) [26])"TARGET_LINKER_FILE_PREFIX",&local_c50);
      local_c58 = &targetFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFileSuffixTag>_*,_true>
                (&local_680,(char (*) [19])"TARGET_FILE_SUFFIX",&local_c58);
      local_c60 = &targetLinkerFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFileSuffixTag>_*,_true>
                (&local_658,(char (*) [26])"TARGET_LINKER_FILE_SUFFIX",&local_c60);
      local_c68 = &targetNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[17],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag>_*,_true>
                (&local_630,(char (*) [17])"TARGET_FILE_NAME",&local_c68);
      local_c70 = &targetLinkerNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag>_*,_true>
                (&local_608,(char (*) [24])"TARGET_LINKER_FILE_NAME",&local_c70);
      local_c78 = &targetSoNameNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag>_*,_true>
                (&local_5e0,(char (*) [24])"TARGET_SONAME_FILE_NAME",&local_c78);
      local_c80 = &targetPdbNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[21],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag>_*,_true>
                (&local_5b8,(char (*) [21])"TARGET_PDB_FILE_NAME",&local_c80);
      local_c88 = &targetNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag>_*,_true>
                (&local_590,(char (*) [16])"TARGET_FILE_DIR",&local_c88);
      local_c90 = &targetLinkerNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag>_*,_true>
                (&local_568,(char (*) [23])"TARGET_LINKER_FILE_DIR",&local_c90);
      local_c98 = &targetSoNameNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag>_*,_true>
                (&local_540,(char (*) [23])"TARGET_SONAME_FILE_DIR",&local_c98);
      local_ca0 = &targetPdbNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[20],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag>_*,_true>
                (&local_518,(char (*) [20])"TARGET_PDB_FILE_DIR",&local_ca0);
      local_ca8 = &targetBundleDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[18],_const_TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag>_*,_true>
                (&local_4f0,(char (*) [18])"TARGET_BUNDLE_DIR",&local_ca8);
      local_cb0 = &targetBundleContentDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[26],_const_TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag>_*,_true>
                (&local_4c8,(char (*) [26])"TARGET_BUNDLE_CONTENT_DIR",&local_cb0);
      local_cb8 = &strEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[9],_const_StrEqualNode_*,_true>
                (&local_4a0,(char (*) [9])"STREQUAL",&local_cb8);
      local_cc0 = &equalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_EqualNode_*,_true>
                (&local_478,(char (*) [6])0x5140e7,&local_cc0);
      local_cc8 = &inListNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_InListNode_*,_true>
                (&local_450,(char (*) [8])"IN_LIST",&local_cc8);
      local_cd0 = &filterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_FilterNode_*,_true>
                (&local_428,(char (*) [7])"FILTER",&local_cd0);
      local_cd8 = &removeDuplicatesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_RemoveDuplicatesNode_*,_true>
                (&local_400,(char (*) [18])"REMOVE_DUPLICATES",&local_cd8);
      local_ce0 = &lowerCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_LowerCaseNode_*,_true>
                (&local_3d8,(char (*) [11])"LOWER_CASE",&local_ce0);
      local_ce8 = &upperCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_UpperCaseNode_*,_true>
                (&local_3b0,(char (*) [11])"UPPER_CASE",&local_ce8);
      local_cf0 = &makeCIdentifierNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_MakeCIdentifierNode_*,_true>
                (&local_388,(char (*) [18])"MAKE_C_IDENTIFIER",&local_cf0);
      local_cf8 = &boolNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_BoolNode_*,_true>
                (&local_360,(char (*) [5])0x4fa91e,&local_cf8);
      local_d00 = &ifNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_IfNode_*,_true>(&local_338,(char (*) [3])0x4f83a2,&local_d00);
      local_d08 = &angle_rNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_CharacterNode<_>_>____true>
                (&local_310,(char (*) [8])"ANGLE-R",&local_d08);
      local_d10 = &commaNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_CharacterNode<_,_>_*,_true>
                (&local_2e8,(char (*) [6])"COMMA",&local_d10);
      local_d18 = &semicolonNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_CharacterNode<___>_*,_true>
                (&local_2c0,(char (*) [10])"SEMICOLON",&local_d18);
      local_d20 = &targetPropertyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_TargetPropertyNode_*,_true>
                (&local_298,(char (*) [16])"TARGET_PROPERTY",&local_d20);
      local_d28 = &targetNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_const_TargetNameNode_*,_true>
                (&local_270,(char (*) [12])0x50bf9b,&local_d28);
      local_d30 = &targetObjectsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_TargetObjectsNode_*,_true>
                (&local_248,(char (*) [15])"TARGET_OBJECTS",&local_d30);
      local_d38 = &targetPolicyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetPolicyNode_*,_true>
                (&local_220,(char (*) [14])"TARGET_POLICY",&local_d38);
      local_d40 = &targetExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetExistsNode_*,_true>
                (&local_1f8,(char (*) [14])"TARGET_EXISTS",&local_d40);
      local_d48 = &targetNameIfExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetNameIfExistsNode_*,_true>
                (&local_1d0,(char (*) [22])"TARGET_NAME_IF_EXISTS",&local_d48);
      local_d50 = &targetGenexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_TargetGenexEvalNode_*,_true>
                (&local_1a8,(char (*) [18])"TARGET_GENEX_EVAL",&local_d50);
      local_d58 = &genexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_GenexEvalNode_*,_true>
                (&local_180,(char (*) [11])0x51416d,&local_d58);
      local_d60 = &buildInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_OneNode_*,_true>
                (&local_158,(char (*) [16])"BUILD_INTERFACE",&local_d60);
      local_d68 = &installInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_ZeroNode_*,_true>
                (&local_130,(char (*) [18])"INSTALL_INTERFACE",&local_d68);
      local_d70 = &installPrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_InstallPrefixNode_*,_true>
                (&local_108,(char (*) [15])0x4f97bb,&local_d70);
      local_d78 = &joinNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_JoinNode_*,_true>(&local_e0,(char (*) [5])"JOIN",&local_d78);
      local_d80 = &linkOnlyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_LinkOnlyNode_*,_true>
                (&local_b8,(char (*) [10])0x4ef88e,&local_d80);
      local_d88 = &languageAndIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompileLanguageAndIdNode_*,_true>
                (&local_90,(char (*) [20])"COMPILE_LANG_AND_ID",&local_d88);
      local_d90 = &languageNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileLanguageNode_*,_true>
                (&local_68,(char (*) [17])"COMPILE_LANGUAGE",&local_d90);
      local_d98 = &shellPathNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_ShellPathNode_*,_true>
                (&local_40,(char (*) [11])"SHELL_PATH",&local_d98);
      __l._M_len = 0x48;
      __l._M_array = &local_b58;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
      ::map(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,__l,&local_d99,&local_d9a);
      lVar4 = -0xb40;
      paVar5 = &local_40.first.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
                   ::~map,&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
          ::find(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t,identifier);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    pcVar3 = (cmGeneratorExpressionNode *)0x0;
  }
  else {
    pcVar3 = *(cmGeneratorExpressionNode **)(cVar2._M_node + 2);
  }
  return pcVar3;
}

Assistant:

const cmGeneratorExpressionNode* cmGeneratorExpressionNode::GetNode(
  const std::string& identifier)
{
  static std::map<std::string, cmGeneratorExpressionNode const*> const nodeMap{
    { "0", &zeroNode },
    { "1", &oneNode },
    { "AND", &andNode },
    { "OR", &orNode },
    { "NOT", &notNode },
    { "C_COMPILER_ID", &cCompilerIdNode },
    { "CXX_COMPILER_ID", &cxxCompilerIdNode },
    { "CUDA_COMPILER_ID", &cudaCompilerIdNode },
    { "Fortran_COMPILER_ID", &fortranCompilerIdNode },
    { "VERSION_GREATER", &versionGreaterNode },
    { "VERSION_GREATER_EQUAL", &versionGreaterEqNode },
    { "VERSION_LESS", &versionLessNode },
    { "VERSION_LESS_EQUAL", &versionLessEqNode },
    { "VERSION_EQUAL", &versionEqualNode },
    { "C_COMPILER_VERSION", &cCompilerVersionNode },
    { "CXX_COMPILER_VERSION", &cxxCompilerVersionNode },
    { "CUDA_COMPILER_VERSION", &cudaCompilerVersionNode },
    { "Fortran_COMPILER_VERSION", &fortranCompilerVersionNode },
    { "PLATFORM_ID", &platformIdNode },
    { "COMPILE_FEATURES", &compileFeaturesNode },
    { "CONFIGURATION", &configurationNode },
    { "CONFIG", &configurationTestNode },
    { "TARGET_FILE", &targetNodeGroup.File },
    { "TARGET_LINKER_FILE", &targetLinkerNodeGroup.File },
    { "TARGET_SONAME_FILE", &targetSoNameNodeGroup.File },
    { "TARGET_PDB_FILE", &targetPdbNodeGroup.File },
    { "TARGET_FILE_BASE_NAME", &targetFileBaseNameNode },
    { "TARGET_LINKER_FILE_BASE_NAME", &targetLinkerFileBaseNameNode },
    { "TARGET_PDB_FILE_BASE_NAME", &targetPdbFileBaseNameNode },
    { "TARGET_FILE_PREFIX", &targetFilePrefixNode },
    { "TARGET_LINKER_FILE_PREFIX", &targetLinkerFilePrefixNode },
    { "TARGET_FILE_SUFFIX", &targetFileSuffixNode },
    { "TARGET_LINKER_FILE_SUFFIX", &targetLinkerFileSuffixNode },
    { "TARGET_FILE_NAME", &targetNodeGroup.FileName },
    { "TARGET_LINKER_FILE_NAME", &targetLinkerNodeGroup.FileName },
    { "TARGET_SONAME_FILE_NAME", &targetSoNameNodeGroup.FileName },
    { "TARGET_PDB_FILE_NAME", &targetPdbNodeGroup.FileName },
    { "TARGET_FILE_DIR", &targetNodeGroup.FileDir },
    { "TARGET_LINKER_FILE_DIR", &targetLinkerNodeGroup.FileDir },
    { "TARGET_SONAME_FILE_DIR", &targetSoNameNodeGroup.FileDir },
    { "TARGET_PDB_FILE_DIR", &targetPdbNodeGroup.FileDir },
    { "TARGET_BUNDLE_DIR", &targetBundleDirNode },
    { "TARGET_BUNDLE_CONTENT_DIR", &targetBundleContentDirNode },
    { "STREQUAL", &strEqualNode },
    { "EQUAL", &equalNode },
    { "IN_LIST", &inListNode },
    { "FILTER", &filterNode },
    { "REMOVE_DUPLICATES", &removeDuplicatesNode },
    { "LOWER_CASE", &lowerCaseNode },
    { "UPPER_CASE", &upperCaseNode },
    { "MAKE_C_IDENTIFIER", &makeCIdentifierNode },
    { "BOOL", &boolNode },
    { "IF", &ifNode },
    { "ANGLE-R", &angle_rNode },
    { "COMMA", &commaNode },
    { "SEMICOLON", &semicolonNode },
    { "TARGET_PROPERTY", &targetPropertyNode },
    { "TARGET_NAME", &targetNameNode },
    { "TARGET_OBJECTS", &targetObjectsNode },
    { "TARGET_POLICY", &targetPolicyNode },
    { "TARGET_EXISTS", &targetExistsNode },
    { "TARGET_NAME_IF_EXISTS", &targetNameIfExistsNode },
    { "TARGET_GENEX_EVAL", &targetGenexEvalNode },
    { "GENEX_EVAL", &genexEvalNode },
    { "BUILD_INTERFACE", &buildInterfaceNode },
    { "INSTALL_INTERFACE", &installInterfaceNode },
    { "INSTALL_PREFIX", &installPrefixNode },
    { "JOIN", &joinNode },
    { "LINK_ONLY", &linkOnlyNode },
    { "COMPILE_LANG_AND_ID", &languageAndIdNode },
    { "COMPILE_LANGUAGE", &languageNode },
    { "SHELL_PATH", &shellPathNode }
  };

  {
    auto itr = nodeMap.find(identifier);
    if (itr != nodeMap.end()) {
      return itr->second;
    }
  }
  return nullptr;
}